

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<BGIP_BnB_Node>::shared_ptr<BGIP_BnB_Node>
          (shared_ptr<BGIP_BnB_Node> *this,BGIP_BnB_Node *p)

{
  sp_counted_base *in_RSI;
  shared_count *in_RDI;
  BGIP_BnB_Node *p_00;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffffe0;
  
  in_RDI->pi_ = in_RSI;
  p_00 = (BGIP_BnB_Node *)(in_RDI + 1);
  detail::shared_count::shared_count((shared_count *)p_00);
  detail::sp_pointer_construct<BGIP_BnB_Node,BGIP_BnB_Node>(in_stack_ffffffffffffffe0,p_00,in_RDI);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }